

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DockNodeIsDropAllowed(ImGuiWindow *host_window,ImGuiWindow *root_payload)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *local_40;
  int local_34;
  ImGuiWindow *payload;
  int payload_n;
  int payload_count;
  ImGuiWindow *root_payload_local;
  ImGuiWindow *host_window_local;
  
  if ((root_payload->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
     (bVar1 = ImGuiDockNode::IsSplitNode(root_payload->DockNodeAsHost), !bVar1)) {
    if (root_payload->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      local_34 = 1;
    }
    else {
      local_34 = (root_payload->DockNodeAsHost->Windows).Size;
    }
    for (payload._0_4_ = 0; (int)payload < local_34; payload._0_4_ = (int)payload + 1) {
      local_40 = root_payload;
      if (root_payload->DockNodeAsHost != (ImGuiDockNode *)0x0) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                            (&root_payload->DockNodeAsHost->Windows,(int)payload);
        local_40 = *ppIVar2;
      }
      bVar1 = DockNodeIsDropAllowedOne(local_40,host_window);
      if (bVar1) {
        return true;
      }
    }
    host_window_local._7_1_ = false;
  }
  else {
    host_window_local._7_1_ = true;
  }
  return host_window_local._7_1_;
}

Assistant:

static bool ImGui::DockNodeIsDropAllowed(ImGuiWindow* host_window, ImGuiWindow* root_payload)
{
    if (root_payload->DockNodeAsHost && root_payload->DockNodeAsHost->IsSplitNode())
        return true;

    const int payload_count = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows.Size : 1;
    for (int payload_n = 0; payload_n < payload_count; payload_n++)
    {
        ImGuiWindow* payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows[payload_n] : root_payload;
        if (DockNodeIsDropAllowedOne(payload, host_window))
            return true;
    }
    return false;
}